

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

wchar_t my_strnicmp(char *a,char *b,wchar_t n)

{
  char cVar1;
  int iVar2;
  char z2;
  byte *pbStack_38;
  char z1;
  char *s2;
  char *s1;
  wchar_t n_local;
  char *b_local;
  char *a_local;
  
  pbStack_38 = (byte *)b;
  s2 = a;
  s1._4_4_ = n;
  while( true ) {
    if (s1._4_4_ < L'\x01') {
      return L'\0';
    }
    iVar2 = toupper((uint)(byte)*s2);
    cVar1 = (char)iVar2;
    iVar2 = toupper((uint)*pbStack_38);
    if (cVar1 < (char)iVar2) {
      return L'\xffffffff';
    }
    if ((char)iVar2 < cVar1) {
      return L'\x01';
    }
    if (cVar1 == '\0') break;
    s2 = s2 + 1;
    pbStack_38 = pbStack_38 + 1;
    s1._4_4_ = s1._4_4_ + L'\xffffffff';
  }
  return L'\0';
}

Assistant:

int my_strnicmp(const char *a, const char *b, int n)
{
	const char *s1, *s2;
	char z1, z2;

	/* Scan the strings */
	for (s1 = a, s2 = b; n > 0; s1++, s2++, n--) {
		z1 = toupper((unsigned char)*s1);
		z2 = toupper((unsigned char)*s2);
		if (z1 < z2) return (-1);
		if (z1 > z2) return (1);
		if (!z1) return (0);
	}

	return 0;
}